

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<chrono::ChAparticle>
          (ChArchiveOut *this,ChNameValue<chrono::ChAparticle_*> *bVal)

{
  iterator iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  ChAparticle *pCVar4;
  mapped_type mVar5;
  ChAparticle *mvalp;
  bool already_stored;
  size_t obj_ID;
  ChValueSpecific<chrono::ChAparticle> specVal;
  bool local_69;
  size_t local_68;
  ChValueSpecific<chrono::ChAparticle> local_60;
  
  pCVar4 = (ChAparticle *)0x0;
  if (this->cut_all_pointers == false) {
    pCVar4 = *bVal->_value;
  }
  local_60.super_ChValue._vptr_ChValue = (_func_int **)pCVar4;
  iVar1 = std::
          _Hashtable<void_*,_void_*,_std::allocator<void_*>,_std::__detail::_Identity,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->cut_pointers)._M_h,(key_type *)&local_60);
  local_69 = false;
  mvalp = (ChAparticle *)0x0;
  if (iVar1.super__Node_iterator_base<void_*,_false>._M_cur == (__node_type *)0x0) {
    mvalp = pCVar4;
  }
  local_68 = 0;
  local_60.super_ChValue._vptr_ChValue = (_func_int **)mvalp;
  iVar2 = std::
          _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->external_ptr_id)._M_h,(key_type *)&local_60);
  if (iVar2.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    PutPointer(this,mvalp,&local_69,&local_68);
    mVar5 = 0;
  }
  else {
    local_69 = true;
    local_60.super_ChValue._vptr_ChValue = (_func_int **)mvalp;
    pmVar3 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->external_ptr_id,(key_type *)&local_60);
    mVar5 = *pmVar3;
  }
  ChValueSpecific<chrono::ChAparticle>::ChValueSpecific(&local_60,mvalp,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xd])(this,&local_60,(ulong)local_69,local_68,mVar5);
  ChValue::~ChValue(&local_60.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue<T*> bVal) {
          
          T* mptr = bVal.value();

          if (this->cut_all_pointers)
              mptr = 0;
          if (this->cut_pointers.find((void*)mptr) != this->cut_pointers.end())
              mptr = 0;
          bool already_stored = false;  
          size_t obj_ID = 0; 
          size_t ext_ID = 0;
          if (this->external_ptr_id.find(static_cast<void*>(mptr)) != this->external_ptr_id.end()) {
              already_stored = true;
              ext_ID = external_ptr_id[static_cast<void*>(mptr)];
          }
          else {
              PutPointer(mptr, already_stored, obj_ID);
          } 
          ChValueSpecific< T > specVal(*mptr, bVal.name(), bVal.flags());
          this->out_ref(
              specVal,
              already_stored,
              obj_ID, 
              ext_ID); // note, this class name is not platform independent
      }